

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O1

void encode_b(AV1_COMP *cpi,TileDataEnc *tile_data,ThreadData_conflict *td,TokenExtra **tp,
             int mi_row,int mi_col,RUN_TYPE dry_run,BLOCK_SIZE bsize,PARTITION_TYPE partition,
             PICK_MODE_CONTEXT *ctx,int *rate)

{
  uint16_t *puVar1;
  CANDIDATE_MV *pCVar2;
  uint8_t *puVar3;
  char cVar4;
  BLOCK_SIZE BVar5;
  uint8_t uVar6;
  _Bool _Var7;
  byte bVar8;
  MOTION_MODE MVar9;
  int iVar10;
  int iVar11;
  SequenceHeader *pSVar12;
  MB_MODE_INFO *pMVar13;
  MB_MODE_INFO_EXT_FRAME *pMVar14;
  MB_MODE_INFO *pMVar15;
  bool bVar16;
  CANDIDATE_MV CVar17;
  CANDIDATE_MV CVar18;
  CANDIDATE_MV CVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  bool bVar23;
  ushort uVar24;
  byte bVar25;
  scale_factors *psVar26;
  uint uVar27;
  char cVar28;
  byte bVar29;
  int iVar30;
  long lVar31;
  ulong uVar32;
  undefined4 uVar34;
  int *piVar33;
  
  pSVar12 = (cpi->common).seq_params;
  iVar30 = pSVar12->subsampling_x;
  iVar10 = pSVar12->subsampling_y;
  uVar32 = (ulong)bsize;
  av1_set_offsets_without_segment_id(cpi,&tile_data->tile_info,&td->mb,mi_row,mi_col,bsize);
  iVar11 = (td->mb).rdmult;
  uVar34 = 0;
  setup_block_rdmult(cpi,&td->mb,mi_row,mi_col,bsize,'\0',(MB_MODE_INFO *)0x0);
  pMVar13 = *(td->mb).e_mbd.mi;
  pMVar13->partition = partition;
  piVar33 = (int *)CONCAT44(uVar34,(uint)dry_run);
  av1_update_state(cpi,td,ctx,mi_row,mi_col,bsize,dry_run);
  if (dry_run != 0) {
    encode_superblock(cpi,tile_data,td,tp,dry_run,bsize,piVar33);
    goto LAB_001ea109;
  }
  *(undefined4 *)((td->mb).mbmi_ext_frame)->cb_offset = *(undefined4 *)(td->mb).cb_offset;
  encode_superblock(cpi,tile_data,td,tp,dry_run,bsize,piVar33);
  puVar1 = (td->mb).cb_offset;
  *puVar1 = *puVar1 + (ushort)block_size_high[uVar32] * (ushort)block_size_wide[uVar32];
  if ((td->mb).e_mbd.is_chroma_ref == true) {
    BVar5 = av1_ss_size_lookup[uVar32][iVar30][iVar10];
    puVar1 = (td->mb).cb_offset + 1;
    *puVar1 = *puVar1 + (ushort)block_size_high[BVar5] * (ushort)block_size_wide[BVar5];
  }
  if (((((cpi->common).seq_params)->sb_size == bsize) && (pMVar13->skip_txfm == '\x01')) &&
     ((cpi->common).delta_q_info.delta_lf_present_flag != 0)) {
    uVar6 = ((cpi->common).seq_params)->monochrome;
    lVar31 = 0;
    do {
      pMVar13->delta_lf[lVar31] = (td->mb).e_mbd.delta_lf[lVar31];
      lVar31 = lVar31 + 1;
    } while ((ulong)(uVar6 == '\0') * 2 + 2 != lVar31);
    pMVar13->delta_lf_from_base = (td->mb).e_mbd.delta_lf_from_base;
  }
  if ('\0' < pMVar13->ref_frame[1]) {
    uVar24 = *(ushort *)&pMVar13->field_0xa7;
    if (((uVar24 >> 9 & 1) == 0) || ((pMVar13->interinter_comp).type == '\0')) {
      uVar24 = uVar24 & 0xfeff;
    }
    else {
      uVar24 = uVar24 | 0x100;
    }
    *(ushort *)&pMVar13->field_0xa7 = uVar24;
  }
  if ((cpi->common).delta_q_info.delta_q_present_flag != 0) {
    pSVar12 = (cpi->common).seq_params;
    uVar27 = (mi_col | mi_row) & pSVar12->mib_size - 1U;
    if (pSVar12->sb_size == bsize) {
      if ((uVar27 == 0) && (pMVar13->skip_txfm == '\0')) {
LAB_001ea2f5:
        (td->mb).e_mbd.current_base_qindex = pMVar13->current_qindex;
        if ((cpi->common).delta_q_info.delta_lf_present_flag != 0) {
          if ((cpi->common).delta_q_info.delta_lf_multi == 0) {
            (td->mb).e_mbd.delta_lf_from_base = pMVar13->delta_lf_from_base;
          }
          else {
            uVar6 = ((cpi->common).seq_params)->monochrome;
            lVar31 = 0;
            do {
              (td->mb).e_mbd.delta_lf[lVar31] = pMVar13->delta_lf[lVar31];
              lVar31 = lVar31 + 1;
            } while ((ulong)(uVar6 == '\0') * 2 + 2 != lVar31);
          }
        }
      }
    }
    else if (uVar27 == 0) goto LAB_001ea2f5;
  }
  uVar24 = *(ushort *)&pMVar13->field_0xa7;
  if ((uVar24 & 0x40) == 0) {
    if ((((cpi->common).seg.enabled == '\0') ||
        (((cpi->common).seg.feature_mask[uVar24 & 7] & 0x20) == 0)) &&
       (((char)uVar24 < '\0' || ('\0' < pMVar13->ref_frame[0])))) {
      (td->mb).e_mbd.neighbors_ref_counts[0] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[1] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[2] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[3] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[4] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[5] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[6] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[7] = '\0';
      _Var7 = (td->mb).e_mbd.left_available;
      if (((td->mb).e_mbd.up_available == true) &&
         ((pMVar15 = (td->mb).e_mbd.above_mbmi, (pMVar15->field_0xa7 & 0x80) != 0 ||
          ('\0' < pMVar15->ref_frame[0])))) {
        puVar3 = (td->mb).e_mbd.neighbors_ref_counts + pMVar15->ref_frame[0];
        *puVar3 = *puVar3 + '\x01';
        if (0 < (long)pMVar15->ref_frame[1]) {
          puVar3 = (td->mb).e_mbd.neighbors_ref_counts + pMVar15->ref_frame[1];
          *puVar3 = *puVar3 + '\x01';
        }
      }
      if ((_Var7 != false) &&
         ((pMVar15 = (td->mb).e_mbd.left_mbmi, (pMVar15->field_0xa7 & 0x80) != 0 ||
          ('\0' < pMVar15->ref_frame[0])))) {
        puVar3 = (td->mb).e_mbd.neighbors_ref_counts + pMVar15->ref_frame[0];
        *puVar3 = *puVar3 + '\x01';
        if (0 < (long)pMVar15->ref_frame[1]) {
          puVar3 = (td->mb).e_mbd.neighbors_ref_counts + pMVar15->ref_frame[1];
          *puVar3 = *puVar3 + '\x01';
        }
      }
      if (((cpi->common).current_frame.reference_mode == '\x02') && ('\0' < pMVar13->ref_frame[1]))
      {
        (td->rd_counts).compound_ref_used_flag = 1;
      }
      bVar29 = pMVar13->ref_frame[0];
      bVar8 = pMVar13->ref_frame[1];
      iVar30 = -1;
      if ((char)bVar29 < '\t') {
        bVar25 = 1;
        if ('\x01' < (char)bVar29) {
          bVar25 = bVar29;
        }
        iVar30 = (cpi->common).remapped_ref_idx[bVar25 - 1];
      }
      psVar26 = (scale_factors *)0x0;
      if (iVar30 != -1) {
        psVar26 = (cpi->common).ref_scale_factors + iVar30;
      }
      (td->mb).e_mbd.block_ref_scale_factors[0] = psVar26;
      goto joined_r0x001ea5c2;
    }
  }
  else {
    (td->rd_counts).skip_mode_used_flag = 1;
    if ((cpi->common).current_frame.reference_mode == '\x02') {
      (td->rd_counts).compound_ref_used_flag = 1;
    }
    bVar29 = pMVar13->ref_frame[0];
    bVar8 = pMVar13->ref_frame[1];
    iVar30 = -1;
    if ((char)bVar29 < '\t') {
      bVar25 = 1;
      if ('\x01' < (char)bVar29) {
        bVar25 = bVar29;
      }
      iVar30 = (cpi->common).remapped_ref_idx[bVar25 - 1];
    }
    psVar26 = (scale_factors *)0x0;
    if (iVar30 != -1) {
      psVar26 = (cpi->common).ref_scale_factors + iVar30;
    }
    (td->mb).e_mbd.block_ref_scale_factors[0] = psVar26;
joined_r0x001ea5c2:
    iVar30 = -1;
    if ((char)bVar8 < '\t') {
      uVar27 = 1;
      if ('\x01' < (char)bVar8) {
        uVar27 = (uint)bVar8;
      }
      iVar30 = (cpi->common).remapped_ref_idx[uVar27 - 1];
    }
    psVar26 = (scale_factors *)0x0;
    if (iVar30 != -1) {
      psVar26 = (cpi->common).ref_scale_factors + iVar30;
    }
    (td->mb).e_mbd.block_ref_scale_factors[1] = psVar26;
  }
  if (tile_data->allow_update_cdf != '\0') {
    update_stats(&cpi->common,td);
  }
  if (((cpi->sf).inter_sf.prune_obmc_prob_thresh + 0x80000001U < 0x80000002) &&
     (((cpi->common).features.allow_warped_motion != true ||
      ((cpi->sf).inter_sf.prune_warped_prob_thresh < 1)))) goto LAB_001ea109;
  bVar16 = true;
  if (-1 < (char)*(ushort *)&pMVar13->field_0xa7) {
    bVar16 = '\0' < pMVar13->ref_frame[0];
  }
  if ((cpi->common).seg.enabled != '\0') {
    bVar16 = (bool)(bVar16 & ((cpi->common).seg.feature_mask[*(ushort *)&pMVar13->field_0xa7 & 7] &
                             0x20) == 0);
  }
  if (!bVar16) goto LAB_001ea109;
  bVar16 = true;
  if (((cpi->common).features.switchable_motion_mode == true) &&
     (pMVar13->overlappable_neighbors != '\0')) {
    iVar30 = (td->mb).e_mbd.cur_frame_force_integer_mv;
    if (iVar30 == 0) {
      bVar29 = block_size_high[pMVar13->bsize];
      if (block_size_wide[pMVar13->bsize] < block_size_high[pMVar13->bsize]) {
        bVar29 = block_size_wide[pMVar13->bsize];
      }
      if (((1 < (td->mb).e_mbd.global_motion[pMVar13->ref_frame[0]].wmtype) &&
          ((pMVar13->mode - 0xf & 0xf7) == 0)) && (7 < bVar29)) goto LAB_001ea7ad;
    }
    bVar29 = block_size_high[pMVar13->bsize];
    if (block_size_wide[pMVar13->bsize] < block_size_high[pMVar13->bsize]) {
      bVar29 = block_size_wide[pMVar13->bsize];
    }
    if (((bVar29 < 8) || ((byte)(pMVar13->mode - 0x19) < 0xf4)) || (-1 < pMVar13->ref_frame[1]))
    goto LAB_001ea7ad;
    if (((iVar30 != 0) || ((cpi->common).features.allow_warped_motion == false)) ||
       (pMVar13->num_proj_ref == '\0')) {
LAB_001ea7f4:
      bVar16 = false;
      goto LAB_001ea7ad;
    }
    psVar26 = (td->mb).e_mbd.block_ref_scale_factors[0];
    iVar30 = psVar26->x_scale_fp;
    bVar23 = true;
    if (((iVar30 != -1) && (iVar10 = psVar26->y_scale_fp, iVar10 != -1)) &&
       (iVar10 != 0x4000 || iVar30 != 0x4000)) goto LAB_001ea7f4;
    bVar16 = false;
  }
  else {
LAB_001ea7ad:
    bVar23 = false;
  }
  if ((!bVar16) && (pMVar13->ref_frame[1] != '\0')) {
    MVar9 = pMVar13->motion_mode;
    piVar33 = (td->rd_counts).obmc_used[uVar32] + (MVar9 == '\x01');
    *piVar33 = *piVar33 + 1;
    if (bVar23) {
      piVar33 = (td->rd_counts).warped_used + (MVar9 == '\x02');
      *piVar33 = *piVar33 + 1;
    }
  }
LAB_001ea109:
  pMVar14 = (td->mb).mbmi_ext_frame;
  pMVar13 = *(td->mb).e_mbd.mi;
  bVar29 = pMVar13->ref_frame[0];
  cVar4 = pMVar13->ref_frame[1];
  if ('\0' < cVar4) {
    cVar28 = -1;
    if (cVar4 < '\x05' || '\x04' < (char)bVar29) {
      lVar31 = 0;
      do {
        if ((bVar29 == (&comp_ref0_lut)[lVar31]) && (cVar4 == (&comp_ref1_lut)[lVar31])) {
          cVar28 = (char)lVar31;
          break;
        }
        lVar31 = lVar31 + 1;
      } while (lVar31 != 9);
    }
    if (cVar28 < '\0') {
      bVar29 = (cVar4 * '\x04' + bVar29) - 0xd;
    }
    else {
      bVar29 = cVar28 + 0x14;
    }
  }
  pCVar2 = (td->mb).mbmi_ext.ref_mv_stack[bVar29];
  CVar17 = *pCVar2;
  CVar18 = pCVar2[1];
  pCVar2 = (td->mb).mbmi_ext.ref_mv_stack[bVar29] + 2;
  CVar19 = pCVar2[1];
  pMVar14->ref_mv_stack[2] = *pCVar2;
  pMVar14->ref_mv_stack[3] = CVar19;
  pMVar14->ref_mv_stack[0] = CVar17;
  pMVar14->ref_mv_stack[1] = CVar18;
  *&pMVar14->weight = (td->mb).mbmi_ext.weight[bVar29];
  pMVar14->mode_context = (td->mb).mbmi_ext.mode_context[bVar29];
  pMVar14->ref_mv_count = (td->mb).mbmi_ext.ref_mv_count[bVar29];
  uVar20 = *(undefined8 *)((td->mb).mbmi_ext.global_mvs + 2);
  uVar21 = *(undefined8 *)((td->mb).mbmi_ext.global_mvs + 4);
  uVar22 = *(undefined8 *)((td->mb).mbmi_ext.global_mvs + 6);
  *(undefined8 *)pMVar14->global_mvs = *(undefined8 *)(td->mb).mbmi_ext.global_mvs;
  *(undefined8 *)(pMVar14->global_mvs + 2) = uVar20;
  *(undefined8 *)(pMVar14->global_mvs + 4) = uVar21;
  *(undefined8 *)(pMVar14->global_mvs + 6) = uVar22;
  (td->mb).rdmult = iVar11;
  return;
}

Assistant:

static void encode_b(const AV1_COMP *const cpi, TileDataEnc *tile_data,
                     ThreadData *td, TokenExtra **tp, int mi_row, int mi_col,
                     RUN_TYPE dry_run, BLOCK_SIZE bsize,
                     PARTITION_TYPE partition, PICK_MODE_CONTEXT *const ctx,
                     int *rate) {
  const AV1_COMMON *const cm = &cpi->common;
  TileInfo *const tile = &tile_data->tile_info;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *xd = &x->e_mbd;
  const int subsampling_x = cm->seq_params->subsampling_x;
  const int subsampling_y = cm->seq_params->subsampling_y;

  av1_set_offsets_without_segment_id(cpi, tile, x, mi_row, mi_col, bsize);
  const int origin_mult = x->rdmult;
  setup_block_rdmult(cpi, x, mi_row, mi_col, bsize, NO_AQ, NULL);
  MB_MODE_INFO *mbmi = xd->mi[0];
  mbmi->partition = partition;
  av1_update_state(cpi, td, ctx, mi_row, mi_col, bsize, dry_run);

  if (!dry_run) {
    set_cb_offsets(x->mbmi_ext_frame->cb_offset, x->cb_offset[PLANE_TYPE_Y],
                   x->cb_offset[PLANE_TYPE_UV]);
    assert(x->cb_offset[PLANE_TYPE_Y] <
           (1 << num_pels_log2_lookup[cpi->common.seq_params->sb_size]));
    assert(x->cb_offset[PLANE_TYPE_UV] <
           ((1 << num_pels_log2_lookup[cpi->common.seq_params->sb_size]) >>
            (subsampling_x + subsampling_y)));
  }

  encode_superblock(cpi, tile_data, td, tp, dry_run, bsize, rate);

  if (!dry_run) {
    update_cb_offsets(x, bsize, subsampling_x, subsampling_y);
    if (bsize == cpi->common.seq_params->sb_size && mbmi->skip_txfm == 1 &&
        cm->delta_q_info.delta_lf_present_flag) {
      const int frame_lf_count =
          av1_num_planes(cm) > 1 ? FRAME_LF_COUNT : FRAME_LF_COUNT - 2;
      for (int lf_id = 0; lf_id < frame_lf_count; ++lf_id)
        mbmi->delta_lf[lf_id] = xd->delta_lf[lf_id];
      mbmi->delta_lf_from_base = xd->delta_lf_from_base;
    }
    if (has_second_ref(mbmi)) {
      if (mbmi->compound_idx == 0 ||
          mbmi->interinter_comp.type == COMPOUND_AVERAGE)
        mbmi->comp_group_idx = 0;
      else
        mbmi->comp_group_idx = 1;
    }

    // delta quant applies to both intra and inter
    const int super_block_upper_left =
        ((mi_row & (cm->seq_params->mib_size - 1)) == 0) &&
        ((mi_col & (cm->seq_params->mib_size - 1)) == 0);
    const DeltaQInfo *const delta_q_info = &cm->delta_q_info;
    if (delta_q_info->delta_q_present_flag &&
        (bsize != cm->seq_params->sb_size || !mbmi->skip_txfm) &&
        super_block_upper_left) {
      xd->current_base_qindex = mbmi->current_qindex;
      if (delta_q_info->delta_lf_present_flag) {
        if (delta_q_info->delta_lf_multi) {
          const int frame_lf_count =
              av1_num_planes(cm) > 1 ? FRAME_LF_COUNT : FRAME_LF_COUNT - 2;
          for (int lf_id = 0; lf_id < frame_lf_count; ++lf_id) {
            xd->delta_lf[lf_id] = mbmi->delta_lf[lf_id];
          }
        } else {
          xd->delta_lf_from_base = mbmi->delta_lf_from_base;
        }
      }
    }

    RD_COUNTS *rdc = &td->rd_counts;
    if (mbmi->skip_mode) {
      assert(!frame_is_intra_only(cm));
      rdc->skip_mode_used_flag = 1;
      if (cm->current_frame.reference_mode == REFERENCE_MODE_SELECT) {
        assert(has_second_ref(mbmi));
        rdc->compound_ref_used_flag = 1;
      }
      set_ref_ptrs(cm, xd, mbmi->ref_frame[0], mbmi->ref_frame[1]);
    } else {
      const int seg_ref_active =
          segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_REF_FRAME);
      if (!seg_ref_active) {
        // If the segment reference feature is enabled we have only a single
        // reference frame allowed for the segment so exclude it from
        // the reference frame counts used to work out probabilities.
        if (is_inter_block(mbmi)) {
          av1_collect_neighbors_ref_counts(xd);
          if (cm->current_frame.reference_mode == REFERENCE_MODE_SELECT) {
            if (has_second_ref(mbmi)) {
              // This flag is also updated for 4x4 blocks
              rdc->compound_ref_used_flag = 1;
            }
          }
          set_ref_ptrs(cm, xd, mbmi->ref_frame[0], mbmi->ref_frame[1]);
        }
      }
    }

    if (tile_data->allow_update_cdf) update_stats(&cpi->common, td);

    // Gather obmc and warped motion count to update the probability.
    if ((cpi->sf.inter_sf.prune_obmc_prob_thresh > 0 &&
         cpi->sf.inter_sf.prune_obmc_prob_thresh < INT_MAX) ||
        (cm->features.allow_warped_motion &&
         cpi->sf.inter_sf.prune_warped_prob_thresh > 0)) {
      const int inter_block = is_inter_block(mbmi);
      const int seg_ref_active =
          segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_REF_FRAME);
      if (!seg_ref_active && inter_block) {
        const MOTION_MODE motion_allowed =
            cm->features.switchable_motion_mode
                ? motion_mode_allowed(xd->global_motion, xd, mbmi,
                                      cm->features.allow_warped_motion)
                : SIMPLE_TRANSLATION;

        if (mbmi->ref_frame[1] != INTRA_FRAME) {
          if (motion_allowed >= OBMC_CAUSAL) {
            td->rd_counts.obmc_used[bsize][mbmi->motion_mode == OBMC_CAUSAL]++;
          }
          if (motion_allowed == WARPED_CAUSAL) {
            td->rd_counts.warped_used[mbmi->motion_mode == WARPED_CAUSAL]++;
          }
        }
      }
    }
  }
  // TODO(Ravi/Remya): Move this copy function to a better logical place
  // This function will copy the best mode information from block
  // level (x->mbmi_ext) to frame level (cpi->mbmi_ext_info.frame_base). This
  // frame level buffer (cpi->mbmi_ext_info.frame_base) will be used during
  // bitstream preparation.
  av1_copy_mbmi_ext_to_mbmi_ext_frame(x->mbmi_ext_frame, &x->mbmi_ext,
                                      av1_ref_frame_type(xd->mi[0]->ref_frame));
  x->rdmult = origin_mult;
}